

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O1

void __thiscall QFontDialogPrivate::updateSizes(QFontDialogPrivate *this)

{
  QWidget *this_00;
  QAbstractItemView *pQVar1;
  QLineEdit *pQVar2;
  QLineEdit *this_01;
  bool bVar3;
  int iVar4;
  QAbstractItemModel *pQVar5;
  QStyle *pQVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  QArrayData *pQVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_f8;
  QArrayData *local_d8;
  int *piStack_d0;
  undefined1 *local_c8;
  QArrayDataPointer<QString> local_c0;
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<QString> local_90;
  QString local_78;
  QArrayData *local_58;
  QString *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar1 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
  iVar4 = (int)local_58;
  lVar7 = (long)(int)local_58;
  if (lVar7 < 0) {
    lVar7 = 0;
    pQVar10 = (QArrayData *)0x0;
  }
  else {
    QAbstractItemView::model(pQVar1);
    QStringListModel::stringList();
    pQVar10 = &(local_c0.ptr[lVar7].d.d)->super_QArrayData;
    lVar7 = local_c0.ptr[lVar7].d.size;
    if (pQVar10 != (QArrayData *)0x0) {
      LOCK();
      (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (-1 < iVar4) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_c0);
  }
  if (pQVar10 != (QArrayData *)0x0) {
    LOCK();
    (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar10,2,0x10);
    }
  }
  if (lVar7 == 0) {
    QLineEdit::clear(this->sizeEdit);
  }
  else {
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    piStack_d0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (QAbstractItemView *)this->familyList;
    QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
    iVar4 = (int)local_58;
    lVar7 = (long)(int)local_58;
    if (lVar7 < 0) {
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
    }
    else {
      QAbstractItemView::model(pQVar1);
      QStringListModel::stringList();
      local_78.d.d = local_a8.ptr[lVar7].d.d;
      local_78.d.ptr = local_a8.ptr[lVar7].d.ptr;
      local_78.d.size = local_a8.ptr[lVar7].d.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (-1 < iVar4) {
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
    }
    pQVar1 = (QAbstractItemView *)this->styleList;
    QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
    iVar4 = (int)local_58;
    lVar7 = (long)(int)local_58;
    if (lVar7 < 0) {
      local_58 = (QArrayData *)0x0;
      pQStack_50 = (QString *)0x0;
      local_48.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      QAbstractItemView::model(pQVar1);
      QStringListModel::stringList();
      local_58 = &(local_90.ptr[lVar7].d.d)->super_QArrayData;
      pQStack_50 = (QString *)local_90.ptr[lVar7].d.ptr;
      local_48.ptr = (QAbstractItemModel *)local_90.ptr[lVar7].d.size;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (-1 < iVar4) {
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_90);
    }
    QFontDatabase::pointSizes((QString *)&local_d8,(QString *)&local_78);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_f8.d = (Data *)0x0;
    local_f8.ptr = (QString *)0x0;
    local_f8.size = 0;
    QList<QString>::reserve((QList<QString> *)&local_f8,(qsizetype)local_c8);
    if (local_c8 == (undefined1 *)0x0) {
      iVar4 = -1;
    }
    else {
      iVar4 = -1;
      iVar9 = 0;
      piVar8 = piStack_d0;
      do {
        QString::number((int)(QString *)&local_58,*piVar8);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_f8,local_f8.size,(QString *)&local_58);
        QList<QString>::end((QList<QString> *)&local_f8);
        if (local_58 != (QArrayData *)0x0) {
          LOCK();
          (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_58,2,0x10);
          }
        }
        if ((iVar4 == -1) && (iVar4 = -1, *piVar8 == this->size)) {
          iVar4 = iVar9;
        }
        iVar9 = iVar9 + 1;
        piVar8 = piVar8 + 1;
      } while (piVar8 != piStack_d0 + (long)local_c8);
    }
    pQVar5 = QAbstractItemView::model((QAbstractItemView *)this->sizeList);
    QStringListModel::setStringList((QList_conflict *)pQVar5);
    if (iVar4 != -1) {
      pQVar1 = (QAbstractItemView *)this->sizeList;
      pQVar5 = QAbstractItemView::model(pQVar1);
      local_78.d.d = (Data *)0xffffffffffffffff;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      (**(code **)(*(long *)pQVar5 + 0x60))((QModelIndex *)&local_58,pQVar5,iVar4,0);
      QAbstractItemView::setCurrentIndex(pQVar1,(QModelIndex *)&local_58);
    }
    pQVar2 = this->sizeEdit;
    if (pQVar2 != (QLineEdit *)0x0) {
      QObject::blockSignals(SUB81(pQVar2,0));
    }
    this_01 = this->sizeEdit;
    if (this->smoothScalable == true) {
      QString::number((int)&local_78,this->size);
    }
    else {
      pQVar1 = (QAbstractItemView *)this->sizeList;
      QAbstractItemView::currentIndex((QModelIndex *)&local_58,pQVar1);
      iVar4 = (int)local_58;
      lVar7 = (long)(int)local_58;
      if (lVar7 < 0) {
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = (char16_t *)0x0;
        local_78.d.size = 0;
      }
      else {
        QAbstractItemView::model(pQVar1);
        QStringListModel::stringList();
        local_78.d.d = pQStack_50[lVar7].d.d;
        local_78.d.ptr = pQStack_50[lVar7].d.ptr;
        local_78.d.size = pQStack_50[lVar7].d.size;
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      if (-1 < iVar4) {
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
      }
    }
    QLineEdit::setText(this_01,&local_78);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar6 = QWidget::style(this_00);
    iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0xd,0,this_00,0);
    if ((iVar4 != 0) && (bVar3 = QWidget::hasFocus((QWidget *)this->sizeList), bVar3)) {
      QLineEdit::selectAll(this->sizeEdit);
    }
    if (pQVar2 != (QLineEdit *)0x0) {
      QObject::blockSignals(SUB81(pQVar2,0));
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d8,4,0x10);
      }
    }
  }
  updateSample(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDialogPrivate::updateSizes()
{
    Q_Q(QFontDialog);

    if (!familyList->currentText().isEmpty()) {
        QList<int> sizes = QFontDatabase::pointSizes(familyList->currentText(), styleList->currentText());

        int i = 0;
        int current = -1;
        QStringList str_sizes;
        str_sizes.reserve(sizes.size());
        for(QList<int>::const_iterator it = sizes.constBegin(); it != sizes.constEnd(); ++it) {
            str_sizes.append(QString::number(*it));
            if (current == -1 && *it == size)
                current = i;
            ++i;
        }
        sizeList->model()->setStringList(str_sizes);
        if (current != -1)
            sizeList->setCurrentItem(current);

        const QSignalBlocker blocker(sizeEdit);
        sizeEdit->setText((smoothScalable ? QString::number(size) : sizeList->currentText()));
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && sizeList->hasFocus())
            sizeEdit->selectAll();
    } else {
        sizeEdit->clear();
    }

    updateSample();
}